

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeFunctionSet * __thiscall
ExpressionContext::GetFunctionSetType(ExpressionContext *this,ArrayView<TypeBase_*> setTypes)

{
  SmallArray<TypeFunctionSet_*,_128U> *this_00;
  IntrusiveList<TypeHandle> types;
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  TypeFunctionSet *pTVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  InplaceStr IVar8;
  IntrusiveList<TypeHandle> setTypeList;
  IntrusiveList<TypeHandle> local_58;
  TypeHandle *local_48;
  TypeHandle *pTStack_40;
  TypeHandle *pTVar3;
  undefined4 extraout_var_00;
  
  this_00 = &this->functionSetTypes;
  uVar5 = (ulong)(this->functionSetTypes).count;
  uVar2 = setTypes.count;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pTVar4 = this_00->data[uVar6];
      if (pTVar4 != (TypeFunctionSet *)0x0) {
        pTVar3 = (pTVar4->types).head;
        if (uVar2 != 0) {
          uVar7 = 0;
          do {
            if ((pTVar3 == (TypeHandle *)0x0) || (pTVar3->type != setTypes.data[uVar7]))
            goto LAB_001499bd;
            uVar7 = uVar7 + 1;
            pTVar3 = pTVar3->next;
          } while (uVar2 != uVar7);
        }
        if (pTVar3 == (TypeHandle *)0x0) {
          return pTVar4;
        }
      }
LAB_001499bd:
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  local_58.head = (TypeHandle *)0x0;
  local_58.tail = (TypeHandle *)0x0;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x18);
      pTVar3 = (TypeHandle *)CONCAT44(extraout_var,iVar1);
      pTVar3->type = setTypes.data[uVar5];
      pTVar3->next = (TypeHandle *)0x0;
      pTVar3->listed = false;
      IntrusiveList<TypeHandle>::push_back(&local_58,pTVar3);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  iVar1 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x70);
  pTVar4 = (TypeFunctionSet *)CONCAT44(extraout_var_00,iVar1);
  types.tail = local_58.tail;
  types.head = local_58.head;
  IVar8 = GetFunctionSetTypeName(this,types);
  (pTVar4->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  (pTVar4->super_TypeBase).typeID = 0x1a;
  (pTVar4->super_TypeBase).name = IVar8;
  (pTVar4->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (pTVar4->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  local_48 = local_58.head;
  pTStack_40 = local_58.tail;
  uVar2 = NULLC::GetStringHash(IVar8.begin,IVar8.end);
  (pTVar4->super_TypeBase).nameHash = uVar2;
  (pTVar4->super_TypeBase).importModule = (ModuleData *)0x0;
  (pTVar4->super_TypeBase).typeIndex = 0xffffffff;
  (pTVar4->super_TypeBase).refType = (TypeRef *)0x0;
  (pTVar4->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(pTVar4->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(pTVar4->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(pTVar4->super_TypeBase).padding + 3) = 0;
  (pTVar4->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223898;
  (pTVar4->types).head = local_48;
  (pTVar4->types).tail = pTStack_40;
  (pTVar4->super_TypeBase).isGeneric = true;
  uVar2 = (this->functionSetTypes).count;
  if (uVar2 == (this->functionSetTypes).max) {
    SmallArray<TypeFunctionSet_*,_128U>::grow(this_00,uVar2);
  }
  if (this_00->data != (TypeFunctionSet **)0x0) {
    uVar2 = (this->functionSetTypes).count;
    (this->functionSetTypes).count = uVar2 + 1;
    this_00->data[uVar2] = pTVar4;
    return pTVar4;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<TypeFunctionSet *, 128>::push_back(const T &) [T = TypeFunctionSet *, N = 128]"
               );
}

Assistant:

TypeFunctionSet* ExpressionContext::GetFunctionSetType(ArrayView<TypeBase*> setTypes)
{
	for(unsigned i = 0, e = functionSetTypes.count; i < e; i++)
	{
		if(TypeFunctionSet *type = functionSetTypes.data[i])
		{
			TypeHandle *leftArg = type->types.head;

			bool match = true;

			for(unsigned i = 0; i < setTypes.size(); i++)
			{
				if(!leftArg || leftArg->type != setTypes[i])
				{
					match = false;
					break;
				}

				leftArg = leftArg->next;
			}

			if(!match)
				continue;

			if(leftArg)
				continue;

			return type;
		}
	}

	IntrusiveList<TypeHandle> setTypeList;

	for(unsigned i = 0; i < setTypes.size(); i++)
		setTypeList.push_back(new (get<TypeHandle>()) TypeHandle(setTypes[i]));

	// Create new type
	TypeFunctionSet* result = new (get<TypeFunctionSet>()) TypeFunctionSet(GetFunctionSetTypeName(*this, setTypeList), setTypeList);

	functionSetTypes.push_back(result);

	// This type is not added to export list

	return result;
}